

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

int lua_pcall(lua_State *L,int nargs,int nresults,int errfunc)

{
  byte bVar1;
  int iVar2;
  GCstr *pGVar3;
  TValue *pTVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(L->glref).ptr32;
  if (errfunc == 0) {
    lVar5 = 0;
  }
  else {
    if (errfunc < 1) {
      pTVar4 = L->top + errfunc;
    }
    else {
      pTVar4 = (TValue *)(uVar6 + 0x130);
      if (L->base + ((ulong)(uint)errfunc - 1) < L->top) {
        pTVar4 = L->base + ((ulong)(uint)errfunc - 1);
      }
    }
    lVar5 = (long)pTVar4 - (ulong)(L->stack).ptr32;
  }
  if (*(int *)(uVar6 + 400) != 0) {
    pTVar4 = L->top;
    L->top = pTVar4 + 1;
    pGVar3 = lj_err_str(L,LJ_ERR_JITCALL);
    (pTVar4->u32).lo = (uint32_t)pGVar3;
    (pTVar4->field_2).it = 0xfffffffb;
    if (*(code **)(uVar6 + 0x178) != (code *)0x0) {
      (**(code **)(uVar6 + 0x178))(L);
    }
    exit(1);
  }
  bVar1 = *(byte *)(uVar6 + 0x109);
  *(byte *)(uVar6 + 0x31c) = *(byte *)(uVar6 + 0x31c) & 0xef;
  iVar2 = lj_vm_pcall(L,L->top + -(long)nargs,nresults + 1,lVar5);
  if (iVar2 != 0) {
    *(byte *)(uVar6 + 0x109) = *(byte *)(uVar6 + 0x109) & 0xf | bVar1 & 0xf0;
  }
  return iVar2;
}

Assistant:

LUA_API int lua_pcall(lua_State *L, int nargs, int nresults, int errfunc)
{
  global_State *g = G(L);
  uint8_t oldh = hook_save(g);
  ptrdiff_t ef;
  int status;
  lj_checkapi(L->status == LUA_OK || L->status == LUA_ERRERR,
	      "thread called in wrong state %d", L->status);
  lj_checkapi_slot(nargs+1);
  if (errfunc == 0) {
    ef = 0;
  } else {
    cTValue *o = index2adr_stack(L, errfunc);
    ef = savestack(L, o);
  }
  /* Forbid Lua world re-entrancy while running the trace */
  if (tvref(g->jit_base)) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITCALL));
    if (g->panic) g->panic(L);
    exit(EXIT_FAILURE);
  }
  lj_trace_abort(g);  /* Never record across Lua VM entrance */
  status = lj_vm_pcall(L, api_call_base(L, nargs), nresults+1, ef);
  if (status) hook_restore(g, oldh);
  return status;
}